

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O1

int __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder>::EncodeHole
          (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder> *this,
          CornerIndex start_corner_id,bool encode_first_vertex)

{
  ulong *puVar1;
  int iVar2;
  CornerTable *pCVar3;
  _Bit_type *p_Var4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  CornerIndex CVar10;
  bool bVar11;
  
  CVar10.value_ = start_corner_id.value_;
  if (start_corner_id.value_ != 0xffffffff) {
    CVar10.value_ =
         ((start_corner_id.value_ * -0x55555555 < 0x55555556) - 1 | 2) + start_corner_id.value_;
  }
  pCVar3 = (this->corner_table_)._M_t.
           super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>._M_t.
           super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
           super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
  bVar11 = CVar10.value_ == 0xffffffff;
  if (!bVar11) {
    do {
      if (*(int *)(*(long *)&(pCVar3->opposite_corners_).vector_.
                             super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                  + (ulong)CVar10.value_ * 4) == -1) break;
      if (!bVar11) {
        CVar10.value_ =
             *(uint *)(*(long *)&(pCVar3->opposite_corners_).vector_.
                                 super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                      + (ulong)CVar10.value_ * 4);
      }
      if (CVar10.value_ != 0xffffffff) {
        uVar9 = CVar10.value_ + 1;
        CVar10.value_ = CVar10.value_ - 2;
        if (0x55555555 < uVar9 * -0x55555555) {
          CVar10.value_ = uVar9;
        }
      }
      bVar11 = CVar10.value_ == 0xffffffff;
    } while (!bVar11);
  }
  if (start_corner_id.value_ == 0xffffffff) {
    uVar9 = 0xffffffff;
  }
  else {
    uVar9 = *(uint *)(*(long *)&(pCVar3->corner_to_vertex_map_).vector_ +
                     (ulong)start_corner_id.value_ * 4);
  }
  if (encode_first_vertex) {
    puVar1 = (this->visited_vertex_ids_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + (uVar9 >> 6);
    *puVar1 = *puVar1 | 1L << ((byte)uVar9 & 0x3f);
  }
  uVar5 = (uint)encode_first_vertex;
  iVar2 = (this->vertex_hole_id_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar9];
  uVar7 = (ulong)iVar2;
  uVar8 = uVar7 + 0x3f;
  if (-1 < (long)uVar7) {
    uVar8 = uVar7;
  }
  puVar1 = (this->visited_holes_).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
           ((long)uVar8 >> 6) +
           (ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
  *puVar1 = *puVar1 | 1L << ((byte)iVar2 & 0x3f);
  uVar6 = CVar10.value_;
  if (!bVar11) {
    uVar6 = ((CVar10.value_ * -0x55555555 < 0x55555556) - 1 | 2) + CVar10.value_;
  }
  if (uVar6 == 0xffffffff) {
    uVar6 = 0xffffffff;
  }
  else {
    uVar6 = *(uint *)(*(long *)&(pCVar3->corner_to_vertex_map_).vector_ + (ulong)uVar6 * 4);
  }
  if (uVar6 != uVar9) {
    p_Var4 = (this->visited_vertex_ids_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    do {
      puVar1 = p_Var4 + (uVar6 >> 6);
      *puVar1 = *puVar1 | 1L << ((byte)uVar6 & 0x3f);
      if (CVar10.value_ != 0xffffffff) {
        uVar6 = CVar10.value_ + 1;
        CVar10.value_ = CVar10.value_ - 2;
        if (0x55555555 < uVar6 * -0x55555555) {
          CVar10.value_ = uVar6;
        }
      }
      bVar11 = CVar10.value_ == 0xffffffff;
      uVar6 = CVar10.value_;
      if (!bVar11) {
        do {
          if (*(int *)(*(long *)&(pCVar3->opposite_corners_).vector_.
                                 super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                      + (ulong)CVar10.value_ * 4) == -1) {
            uVar6 = CVar10.value_;
            if (!bVar11) {
              uVar6 = ((CVar10.value_ * -0x55555555 < 0x55555556) - 1 | 2) + CVar10.value_;
            }
            break;
          }
          if (!bVar11) {
            CVar10.value_ =
                 *(uint *)(*(long *)&(pCVar3->opposite_corners_).vector_.
                                     super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                          + (ulong)CVar10.value_ * 4);
          }
          if (CVar10.value_ != 0xffffffff) {
            uVar6 = CVar10.value_ + 1;
            CVar10.value_ = CVar10.value_ - 2;
            if (0x55555555 < uVar6 * -0x55555555) {
              CVar10.value_ = uVar6;
            }
          }
          bVar11 = CVar10.value_ == 0xffffffff;
          uVar6 = CVar10.value_;
        } while (!bVar11);
      }
      if (uVar6 == 0xffffffff) {
        uVar6 = 0xffffffff;
      }
      else {
        uVar6 = *(uint *)(*(long *)&(pCVar3->corner_to_vertex_map_).vector_ + (ulong)uVar6 * 4);
      }
      uVar5 = uVar5 + 1;
    } while (uVar6 != uVar9);
  }
  return uVar5;
}

Assistant:

int MeshEdgebreakerEncoderImpl<TraversalEncoder>::EncodeHole(
    CornerIndex start_corner_id, bool encode_first_vertex) {
  // We know that the start corner lies on a hole but we first need to find the
  // boundary edge going from that vertex. It is the first edge in CW
  // direction.
  CornerIndex corner_id = start_corner_id;
  corner_id = corner_table_->Previous(corner_id);
  while (corner_table_->Opposite(corner_id) != kInvalidCornerIndex) {
    corner_id = corner_table_->Opposite(corner_id);
    corner_id = corner_table_->Next(corner_id);
  }
  const VertexIndex start_vertex_id = corner_table_->Vertex(start_corner_id);

  int num_encoded_hole_verts = 0;
  if (encode_first_vertex) {
    visited_vertex_ids_[start_vertex_id.value()] = true;
    ++num_encoded_hole_verts;
  }

  // corner_id is now opposite to the boundary edge.
  // Mark the hole as visited.
  visited_holes_[vertex_hole_id_[start_vertex_id.value()]] = true;
  // Get the start vertex of the edge and use it as a reference.
  VertexIndex start_vert_id =
      corner_table_->Vertex(corner_table_->Next(corner_id));
  // Get the end vertex of the edge.
  VertexIndex act_vertex_id =
      corner_table_->Vertex(corner_table_->Previous(corner_id));
  while (act_vertex_id != start_vertex_id) {
    // Encode the end vertex of the boundary edge.

    start_vert_id = act_vertex_id;

    // Mark the vertex as visited.
    visited_vertex_ids_[act_vertex_id.value()] = true;
    ++num_encoded_hole_verts;
    corner_id = corner_table_->Next(corner_id);
    // Look for the next attached open boundary edge.
    while (corner_table_->Opposite(corner_id) != kInvalidCornerIndex) {
      corner_id = corner_table_->Opposite(corner_id);
      corner_id = corner_table_->Next(corner_id);
    }
    act_vertex_id = corner_table_->Vertex(corner_table_->Previous(corner_id));
  }
  return num_encoded_hole_verts;
}